

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PODVector.H
# Opt level: O0

void __thiscall
amrex::PODVector<amrex::XDim3,_std::allocator<amrex::XDim3>_>::AllocateBuffer
          (PODVector<amrex::XDim3,_std::allocator<amrex::XDim3>_> *this,size_type a_capacity)

{
  XDim3 *pXVar1;
  size_type in_RSI;
  PODVector<amrex::XDim3,_std::allocator<amrex::XDim3>_> *in_RDI;
  pointer new_data;
  XDim3 *in_stack_ffffffffffffffb8;
  void *in_stack_ffffffffffffffc0;
  pointer pXVar2;
  size_type in_stack_ffffffffffffffc8;
  XDim3 *src;
  new_allocator<amrex::XDim3> *in_stack_ffffffffffffffd0;
  
  pXVar1 = __gnu_cxx::new_allocator<amrex::XDim3>::allocate
                     (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0)
  ;
  if (in_RDI->m_data != (pointer)0x0) {
    pXVar2 = in_RDI->m_data;
    src = pXVar1;
    size(in_RDI);
    detail::memCopyImpl<std::allocator<amrex::XDim3>>
              (pXVar2,src,(size_t)in_stack_ffffffffffffffc0,
               (allocator<amrex::XDim3> *)in_stack_ffffffffffffffb8);
    Gpu::streamSynchronize();
  }
  pXVar2 = in_RDI->m_data;
  capacity(in_RDI);
  __gnu_cxx::new_allocator<amrex::XDim3>::deallocate
            ((new_allocator<amrex::XDim3> *)pXVar2,in_stack_ffffffffffffffb8,0x1675355);
  in_RDI->m_data = pXVar1;
  in_RDI->m_capacity = in_RSI;
  return;
}

Assistant:

void AllocateBuffer (size_type a_capacity) noexcept
        {
            pointer new_data = allocate(a_capacity);
            if (m_data) {
                detail::memCopyImpl<Allocator>(new_data, m_data, size() * sizeof(T), *this);
                amrex::Gpu::streamSynchronize();
            }
            deallocate(m_data, capacity());
            m_data = new_data;
            m_capacity = a_capacity;
        }